

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::MapNativeTableField
          (RustGenerator *this,FieldDef *field,string *expr)

{
  bool bVar1;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *expr_local;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  local_20 = expr;
  expr_local = (string *)field;
  field_local = (FieldDef *)this;
  bVar1 = FieldDef::IsOptional(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"  let {{FIELD}} = self.{{FIELD}}.as_ref().map(|x|{",&local_41);
    CodeWriter::operator+=(&this->code_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::operator+(&local_78,"    ",local_20);
    CodeWriter::operator+=(&this->code_,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"  });",&local_99);
    CodeWriter::operator+=(&this->code_,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"  let {{FIELD}} = Some({",&local_c1);
    CodeWriter::operator+=(&this->code_,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"    let x = &self.{{FIELD}};",&local_e9);
    CodeWriter::operator+=(&this->code_,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::operator+(&local_110,"    ",local_20);
    CodeWriter::operator+=(&this->code_,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"  });",&local_131);
    CodeWriter::operator+=(&this->code_,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  return;
}

Assistant:

void MapNativeTableField(const FieldDef &field, const std::string &expr) {
    if (field.IsOptional()) {
      code_ += "  let {{FIELD}} = self.{{FIELD}}.as_ref().map(|x|{";
      code_ += "    " + expr;
      code_ += "  });";
    } else {
      // For some reason Args has optional types for required fields.
      // TODO(cneo): Fix this... but its a breaking change?
      code_ += "  let {{FIELD}} = Some({";
      code_ += "    let x = &self.{{FIELD}};";
      code_ += "    " + expr;
      code_ += "  });";
    }
  }